

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O2

void __thiscall
TIFFImageHandler::WriteXObjectCS(TIFFImageHandler *this,DictionaryContext *inContainerDictionary)

{
  t2p_cs_t *ptVar1;
  float fVar2;
  float fVar3;
  t2p_cs_t tVar4;
  T2P *pTVar5;
  DictionaryContext *this_00;
  ObjectIDType indirectObjectID;
  ObjectsContext *this_01;
  
  tVar4 = this->mT2p->pdf_colorspace;
  if ((char)tVar4 < '\0') {
    ObjectsContext::StartArray(this->mObjectsContext);
    ObjectsContext::WriteName(this->mObjectsContext,&scICCBased_abi_cxx11_,eTokenSeparatorSpace);
    this_01 = this->mObjectsContext;
    indirectObjectID = this->mT2p->pdf_icccs;
  }
  else {
    if ((tVar4 >> 0xc & 1) == 0) {
      if (((tVar4 & T2P_CS_BILEVEL) != 0) &&
         ((this->mUserParameters).BWTreatment.AsImageMask == false)) {
        if (inContainerDictionary == (DictionaryContext *)0x0) {
          ObjectsContext::WriteName
                    (this->mObjectsContext,&scDeviceGray_abi_cxx11_,eTokenSeparatorSpace);
        }
        else {
          DictionaryContext::WriteNameValue(inContainerDictionary,&scDeviceGray_abi_cxx11_);
        }
      }
      tVar4 = this->mT2p->pdf_colorspace;
      if ((tVar4 & T2P_CS_GRAY) != 0) {
        if ((tVar4 & T2P_CS_CALGRAY) == 0) {
          if ((this->mUserParameters).GrayscaleTreatment.AsColorMap == true) {
            WriteIndexedCSForBiLevelColorMap(this);
          }
          else if (inContainerDictionary == (DictionaryContext *)0x0) {
            ObjectsContext::WriteName
                      (this->mObjectsContext,&scDeviceGray_abi_cxx11_,eTokenSeparatorSpace);
          }
          else {
            DictionaryContext::WriteNameValue(inContainerDictionary,&scDeviceGray_abi_cxx11_);
          }
        }
        else {
          WriteXObjectCALCS(this);
        }
      }
      tVar4 = this->mT2p->pdf_colorspace;
      if ((tVar4 & T2P_CS_RGB) != 0) {
        if ((tVar4 & T2P_CS_CALRGB) == 0) {
          if (inContainerDictionary == (DictionaryContext *)0x0) {
            ObjectsContext::WriteName
                      (this->mObjectsContext,&scDeviceRGB_abi_cxx11_,eTokenSeparatorSpace);
          }
          else {
            DictionaryContext::WriteNameValue(inContainerDictionary,&scDeviceRGB_abi_cxx11_);
          }
        }
        else {
          WriteXObjectCALCS(this);
        }
      }
      if ((this->mT2p->pdf_colorspace & T2P_CS_CMYK) != 0) {
        if (inContainerDictionary == (DictionaryContext *)0x0) {
          ObjectsContext::WriteName
                    (this->mObjectsContext,&scDeviceCMYK_abi_cxx11_,eTokenSeparatorSpace);
        }
        else {
          DictionaryContext::WriteNameValue(inContainerDictionary,&scDeviceCMYK_abi_cxx11_);
        }
      }
      if ((this->mT2p->pdf_colorspace & T2P_CS_LAB) == 0) {
        return;
      }
      ObjectsContext::StartArray(this->mObjectsContext);
      ObjectsContext::WriteName(this->mObjectsContext,&scLab_abi_cxx11_,eTokenSeparatorSpace);
      this_00 = ObjectsContext::StartDictionary(this->mObjectsContext);
      DictionaryContext::WriteKey(this_00,&scWhitePoint_abi_cxx11_);
      fVar2 = this->mT2p->tiff_whitechromaticities[0];
      fVar3 = this->mT2p->tiff_whitechromaticities[1];
      ObjectsContext::StartArray(this->mObjectsContext);
      ObjectsContext::WriteDouble
                (this->mObjectsContext,(double)(fVar2 / fVar3),eTokenSeparatorSpace);
      ObjectsContext::WriteDouble(this->mObjectsContext,1.0,eTokenSeparatorSpace);
      ObjectsContext::WriteDouble
                (this->mObjectsContext,(double)((1.0 - (fVar2 + fVar3)) / fVar3),
                 eTokenSeparatorSpace);
      ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorNone);
      ObjectsContext::StartArray(this->mObjectsContext);
      ObjectsContext::WriteDouble(this->mObjectsContext,0.9642956256866455,eTokenSeparatorSpace);
      ObjectsContext::WriteDouble(this->mObjectsContext,1.0,eTokenSeparatorSpace);
      ObjectsContext::WriteDouble(this->mObjectsContext,0.8251045346260071,eTokenSeparatorSpace);
      ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
      DictionaryContext::WriteKey(this_00,&scRange_abi_cxx11_);
      ObjectsContext::StartArray(this->mObjectsContext);
      ObjectsContext::WriteInteger
                (this->mObjectsContext,(long)this->mT2p->pdf_labrange[0],eTokenSeparatorSpace);
      ObjectsContext::WriteInteger
                (this->mObjectsContext,(long)this->mT2p->pdf_labrange[1],eTokenSeparatorSpace);
      ObjectsContext::WriteInteger
                (this->mObjectsContext,(long)this->mT2p->pdf_labrange[2],eTokenSeparatorSpace);
      ObjectsContext::WriteInteger
                (this->mObjectsContext,(long)this->mT2p->pdf_labrange[3],eTokenSeparatorSpace);
      ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
      ObjectsContext::EndDictionary(this->mObjectsContext,this_00);
      goto LAB_001b68b3;
    }
    ObjectsContext::StartArray(this->mObjectsContext);
    ObjectsContext::WriteName(this->mObjectsContext,&scIndexed_abi_cxx11_,eTokenSeparatorSpace);
    ptVar1 = &this->mT2p->pdf_colorspace;
    *ptVar1 = *ptVar1 ^ T2P_CS_PALETTE;
    WriteXObjectCS(this,(DictionaryContext *)0x0);
    pTVar5 = this->mT2p;
    ptVar1 = &pTVar5->pdf_colorspace;
    *ptVar1 = *ptVar1 | T2P_CS_PALETTE;
    ObjectsContext::WriteInteger
              (this->mObjectsContext,(ulong)(uint)~(-1 << ((byte)pTVar5->tiff_bitspersample & 0x1f))
               ,eTokenSeparatorSpace);
    this_01 = this->mObjectsContext;
    indirectObjectID = this->mT2p->pdf_palettecs;
  }
  ObjectsContext::WriteNewIndirectObjectReference(this_01,indirectObjectID,eTokenSeparatorSpace);
LAB_001b68b3:
  ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
  return;
}

Assistant:

void TIFFImageHandler::WriteXObjectCS(DictionaryContext* inContainerDictionary)
{
	float X_W=1.0;
	float Y_W=1.0;
	float Z_W=1.0;
	
	if( (mT2p->pdf_colorspace & T2P_CS_ICCBASED) != 0)
	{
		mObjectsContext->StartArray();
		mObjectsContext->WriteName(scICCBased);
		mObjectsContext->WriteNewIndirectObjectReference(mT2p->pdf_icccs);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);
		return;
	}

	if( (mT2p->pdf_colorspace & T2P_CS_PALETTE) != 0)
	{
		mObjectsContext->StartArray();
		mObjectsContext->WriteName(scIndexed);
		mT2p->pdf_colorspace = (t2p_cs_t)(mT2p->pdf_colorspace ^ T2P_CS_PALETTE);
		WriteXObjectCS(NULL);
		mT2p->pdf_colorspace = (t2p_cs_t)(mT2p->pdf_colorspace | T2P_CS_PALETTE);
		mObjectsContext->WriteInteger((0x0001 << mT2p->tiff_bitspersample)-1);
		mObjectsContext->WriteNewIndirectObjectReference(mT2p->pdf_palettecs);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);
		return;
	}

	if((mT2p->pdf_colorspace & T2P_CS_BILEVEL) && !mUserParameters.BWTreatment.AsImageMask)
	{
		if(inContainerDictionary)
			inContainerDictionary->WriteNameValue(scDeviceGray);
		else
			mObjectsContext->WriteName(scDeviceGray);
	}
		
	if(mT2p->pdf_colorspace & T2P_CS_GRAY)
	{
		if(mT2p->pdf_colorspace & T2P_CS_CALGRAY)
		{
			WriteXObjectCALCS();
		} 
		else 
		{
			if(mUserParameters.GrayscaleTreatment.AsColorMap)
			{
				WriteIndexedCSForBiLevelColorMap();
			}
			else
			{
				if(inContainerDictionary)
					inContainerDictionary->WriteNameValue(scDeviceGray);
				else
					mObjectsContext->WriteName(scDeviceGray);
			}
		}
	}

	if(mT2p->pdf_colorspace & T2P_CS_RGB)
	{
		if(mT2p->pdf_colorspace & T2P_CS_CALRGB)
		{
			WriteXObjectCALCS();
		} 
		else 
		{
			if(inContainerDictionary)
				inContainerDictionary->WriteNameValue(scDeviceRGB);
			else
				mObjectsContext->WriteName(scDeviceRGB);
		}
	}

	if(mT2p->pdf_colorspace & T2P_CS_CMYK)
	{
		if(inContainerDictionary)
			inContainerDictionary->WriteNameValue(scDeviceCMYK);
		else
			mObjectsContext->WriteName(scDeviceCMYK);
	}

	if(mT2p->pdf_colorspace & T2P_CS_LAB)
	{
		mObjectsContext->StartArray();
		mObjectsContext->WriteName(scLab);

		DictionaryContext* labDictionary = mObjectsContext->StartDictionary();
		labDictionary->WriteKey(scWhitePoint);
		X_W = mT2p->tiff_whitechromaticities[0];
		Y_W = mT2p->tiff_whitechromaticities[1];
		Z_W = 1.0F - (X_W + Y_W);
		X_W /= Y_W;
		Z_W /= Y_W;
		Y_W = 1.0F;
		mObjectsContext->StartArray();
		mObjectsContext->WriteDouble(X_W);
		mObjectsContext->WriteDouble(Y_W);
		mObjectsContext->WriteDouble(Z_W);
		mObjectsContext->EndArray();
		
		X_W = 0.3457F; /* 0.3127F; */ /* D50, commented D65 */
		Y_W = 0.3585F; /* 0.3290F; */
		Z_W = 1.0F - (X_W + Y_W);
		X_W /= Y_W;
		Z_W /= Y_W;
		Y_W = 1.0F;
		mObjectsContext->StartArray();
		mObjectsContext->WriteDouble(X_W);
		mObjectsContext->WriteDouble(Y_W);
		mObjectsContext->WriteDouble(Z_W);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);

		labDictionary->WriteKey(scRange);
		mObjectsContext->StartArray();
		mObjectsContext->WriteInteger(mT2p->pdf_labrange[0]);
		mObjectsContext->WriteInteger(mT2p->pdf_labrange[1]);
		mObjectsContext->WriteInteger(mT2p->pdf_labrange[2]);
		mObjectsContext->WriteInteger(mT2p->pdf_labrange[3]);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);
		
		mObjectsContext->EndDictionary(labDictionary);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);
			
	}
}